

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O3

int set_bucket_realloc(set s)

{
  void *__ptr;
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  float fVar5;
  undefined8 local_48;
  size_t local_40;
  size_t sStack_38;
  bucket local_30;
  set_cb_hash local_28;
  set_cb_compare p_Stack_20;
  
  fVar5 = (float)s->count / (float)s->capacity;
  if (((s->prime == 0) || (lVar3 = -1, 0.1 < fVar5)) && (lVar3 = 1, fVar5 < 0.77)) {
    return 0;
  }
  sStack_38 = s->prime + lVar3;
  local_28 = s->hash_cb;
  p_Stack_20 = s->compare_cb;
  local_48 = 0;
  local_40 = bucket_capacity(sStack_38);
  local_30 = bucket_create(local_40);
  if (local_30 == (bucket)0x0) {
    iVar1 = 1;
  }
  else {
    set_iterate(s,set_bucket_realloc_iterator,&local_48);
    uVar2 = s->capacity;
    if (uVar2 != 0) {
      lVar3 = 0x10;
      uVar4 = 0;
      do {
        __ptr = *(void **)((long)&s->buckets->count + lVar3);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          uVar2 = s->capacity;
        }
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x18;
      } while (uVar4 < uVar2);
    }
    free(s->buckets);
    s->capacity = local_40;
    s->prime = sStack_38;
    s->buckets = local_30;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int set_bucket_realloc(set s)
{
	struct set_type new_set;
	size_t prime = s->prime;
	float ratio = (float)((float)s->count / (float)s->capacity);

	if (prime > 0 && ratio <= SET_BUCKET_RATIO_MIN)
	{
		--prime;
	}
	else if (ratio >= SET_BUCKET_RATIO_MAX)
	{
		++prime;
	}
	else
	{
		return 0;
	}

	new_set.hash_cb = s->hash_cb;
	new_set.compare_cb = s->compare_cb;
	new_set.count = 0;
	new_set.prime = prime;
	new_set.capacity = bucket_capacity(prime);
	new_set.buckets = bucket_create(new_set.capacity);

	if (new_set.buckets != NULL)
	{
		size_t iterator;

		set_iterate(s, &set_bucket_realloc_iterator, &new_set);

		for (iterator = 0; iterator < s->capacity; ++iterator)
		{
			bucket b = &s->buckets[iterator];

			if (b->pairs != NULL)
			{
				free(b->pairs);
			}
		}

		free(s->buckets);

		s->capacity = new_set.capacity;
		s->prime = new_set.prime;
		s->buckets = new_set.buckets;

		return 0;
	}

	return 1;
}